

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::genAggLoopStringCompressed
          (CppGenerator *this,TDNode *node,size_t currentLoop,size_t depth,
          dyn_bitset *contributingViews,size_t numOfOutViewLoops,string *resetString)

{
  value_type vVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  size_t sVar6;
  reference pvVar7;
  pointer ppVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  AggregateIndexes *pAVar12;
  reference pvVar13;
  AggregateIndexes *pAVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  TDNode *in_RCX;
  CppGenerator *in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t in_R8;
  size_t in_R9;
  bool bVar16;
  size_t unaff_retaddr;
  string *in_stack_00000008;
  string *in_stack_00000010;
  size_t resetOffset;
  string postLoop;
  string view;
  string local_res420;
  string prev;
  AggRegTuple *regTuple_5;
  size_t aggID_3;
  AggRegTuple *regTuple_4;
  AggRegTuple *regTuple_3;
  bool addedAggregates_1;
  size_t off_1;
  size_t aggID_2;
  bitset<7UL> increasingIndexes_1;
  AggregateIndexes aggIdx_1;
  AggregateIndexes bench_1;
  size_t startingOffset;
  string post;
  string local_res6f8;
  AggRegTuple *regTuple_2;
  size_t aggID_1;
  AggRegTuple *regTuple_1;
  AggRegTuple *regTuple;
  bool addedAggregates;
  size_t off;
  size_t aggID;
  bitset<7UL> increasingIndexes;
  AggregateIndexes aggIdx;
  AggregateIndexes bench;
  string resetAggregates;
  string closeLoopString;
  string loopString;
  size_t viewID;
  size_t nextLoop;
  size_t next;
  pair<unsigned_long,_unsigned_long> *viewAgg;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  string viewProduct;
  size_t viewProd;
  iterator local_it_1;
  string local;
  iterator local_it;
  size_t f;
  size_t highestPosition;
  bool foundSubProduct;
  size_t subProductID;
  prod_bitset removedFunctions;
  prod_bitset subProduct;
  string productString;
  bool decomposedProduct;
  prod_bitset *product;
  size_t prodID;
  string depthString;
  size_t numOfLoops;
  dyn_bitset *thisLoop;
  size_t thisLoopID;
  string *returnString;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffe588;
  AggregateIndexes *in_stack_ffffffffffffe590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe598;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffe5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5b0;
  unsigned_long uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5c0;
  CppGenerator *in_stack_ffffffffffffe5c8;
  undefined7 in_stack_ffffffffffffe5d0;
  undefined1 in_stack_ffffffffffffe5d7;
  AggregateIndexes *in_stack_ffffffffffffe5d8;
  CppGenerator *in_stack_ffffffffffffe5e0;
  AggregateIndexes *in_stack_ffffffffffffe5e8;
  AggregateIndexes *this_00;
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [32];
  string local_18a0 [32];
  string local_1880 [32];
  string local_1860 [16];
  prod_bitset *in_stack_ffffffffffffe7b0;
  dyn_bitset *in_stack_ffffffffffffe7b8;
  TDNode *in_stack_ffffffffffffe7c0;
  CppGenerator *in_stack_ffffffffffffe7c8;
  string local_1820 [32];
  _Alloc_hider *local_1800;
  string local_17f8 [32];
  string local_17d8 [32];
  string local_17b8 [32];
  string local_1798 [32];
  string local_1778 [32];
  string local_1758 [32];
  string local_1738 [32];
  string local_1718 [32];
  string local_16f8 [32];
  string local_16d8 [32];
  string local_16b8 [32];
  string local_1698 [32];
  string local_1678 [32];
  string local_1658 [32];
  string local_1638 [32];
  string local_1618 [32];
  string local_15f8 [32];
  string local_15d8 [32];
  string local_15b8 [32];
  string local_1598 [32];
  string local_1578 [32];
  string local_1558 [32];
  reference local_1538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1530;
  string local_1528 [32];
  string local_1508 [32];
  reference local_14e8;
  reference local_14e0;
  byte local_14d1;
  long local_14d0;
  AggregateIndexes *local_14c8;
  undefined1 local_14b8 [72];
  undefined1 local_1470 [72];
  ulong local_1428;
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [32];
  string local_13a0 [32];
  string local_1380 [32];
  string local_1360 [32];
  string local_1340 [32];
  string local_1320 [32];
  string local_1300 [32];
  string local_12e0 [32];
  reference local_12c0;
  ulong local_12b8;
  string local_12b0 [32];
  string local_1290 [32];
  reference local_1270;
  reference local_1268;
  byte local_1259;
  long local_1258;
  ulong local_1250;
  undefined1 local_1240 [72];
  undefined1 local_11f8 [47];
  undefined1 in_stack_ffffffffffffee37;
  size_t in_stack_ffffffffffffee38;
  bitset<7UL> *in_stack_ffffffffffffee40;
  size_t in_stack_ffffffffffffee48;
  AggregateIndexes *in_stack_ffffffffffffee50;
  CppGenerator *in_stack_ffffffffffffee58;
  string local_1190 [32];
  string local_1170 [39];
  allocator local_1149;
  undefined1 local_1148 [64];
  string local_1108 [32];
  string local_10e8 [32];
  string local_10c8 [32];
  string local_10a8 [32];
  string local_1088 [32];
  string local_1068 [32];
  string local_1048 [32];
  string local_1028 [32];
  string local_1008 [32];
  string local_fe8 [32];
  string local_fc8 [32];
  string local_fa8 [32];
  string local_f88 [32];
  string local_f68 [32];
  string local_f48 [32];
  string local_f28 [32];
  string local_f08 [32];
  string local_ee8 [32];
  string local_ec8 [32];
  string local_ea8 [32];
  string local_e88 [32];
  string local_e68 [32];
  string local_e48 [32];
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8 [32];
  string local_da8 [32];
  string local_d88 [32];
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  string local_d08 [32];
  string local_ce8 [32];
  string local_cc8 [32];
  string local_ca8 [32];
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [32];
  string local_c28 [32];
  string local_c08 [32];
  string local_be8 [32];
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string local_908 [32];
  string local_8e8 [32];
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [39];
  allocator local_6c1;
  string local_6c0 [39];
  allocator local_699;
  string local_698 [32];
  size_type local_678;
  size_type local_650;
  ulong local_648;
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  reference local_4c0;
  pair<unsigned_long,_unsigned_long> *local_4b8;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_4b0;
  reference local_4a8;
  allocator local_499;
  string local_498 [32];
  ulong local_478;
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false> local_2f0;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false> local_2e8;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false> local_280;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false> local_278;
  reference local_270;
  long local_260;
  long local_258;
  byte local_249;
  unsigned_long local_248;
  undefined1 local_180 [199];
  allocator local_b9;
  string local_b8 [39];
  byte local_91;
  reference local_90;
  ulong local_88;
  string local_80 [54];
  allocator local_4a;
  byte local_49;
  _Alloc_hider *local_48;
  reference local_40;
  TDNode *node_00;
  
  node_00 = in_RCX;
  local_40 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RSI + 0x550),(size_type)in_RCX);
  sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                    (in_stack_ffffffffffffe5a0);
  local_48 = &in_stack_00000008->_M_dataplus + sVar4;
  local_49 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_4a);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
  local_88 = 0;
  while( true ) {
    uVar2 = local_88;
    pvVar5 = std::
             vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
             ::operator[]((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                           *)(in_RSI + 0x3a0),(size_type)in_RCX);
    sVar4 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size(pvVar5);
    if (sVar4 <= uVar2) break;
    pvVar5 = std::
             vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
             ::operator[]((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                           *)(in_RSI + 0x3a0),(size_type)in_RCX);
    local_90 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                         (pvVar5,local_88);
    local_91 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"",&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    sVar6 = std::bitset<1500UL>::count((bitset<1500UL> *)0x2c2be2);
    if (1 < sVar6) {
      memcpy(local_180,local_90,0xc0);
      std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2c2c13);
      local_249 = 0;
      while( true ) {
        bVar16 = false;
        if ((local_249 & 1) == 0) {
          sVar6 = std::bitset<1500UL>::count((bitset<1500UL> *)0x2c2c3b);
          bVar16 = 1 < sVar6;
        }
        if (!bVar16) break;
        local_258 = 0;
        for (local_260 = 0x5dc; local_260 != 0; local_260 = local_260 + -1) {
          std::bitset<1500UL>::operator[]
                    ((bitset<1500UL> *)in_stack_ffffffffffffe598,(size_t)in_stack_ffffffffffffe590);
          bVar16 = std::bitset::reference::operator_cast_to_bool
                             ((reference *)in_stack_ffffffffffffe590);
          std::bitset<1500UL>::reference::~reference(&local_270);
          if (bVar16) {
            local_258 = local_260;
            break;
          }
        }
        std::bitset<1500UL>::reset
                  ((bitset<1500UL> *)in_stack_ffffffffffffe590,(size_t)in_stack_ffffffffffffe588);
        std::bitset<1500UL>::set
                  ((bitset<1500UL> *)in_stack_ffffffffffffe5a0,(size_t)in_stack_ffffffffffffe598,
                   SUB81((ulong)in_stack_ffffffffffffe590 >> 0x38,0));
        std::
        vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                      *)(in_RSI + 0x388),(size_type)in_RCX);
        local_278._M_cur =
             (__node_type *)
             std::
             unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
             ::find((unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
                     *)in_stack_ffffffffffffe588,(key_type *)0x2c2ddd);
        std::
        vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                      *)(in_RSI + 0x388),(size_type)in_RCX);
        local_280._M_cur =
             (__node_type *)
             std::
             unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
             ::end((unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
                    *)in_stack_ffffffffffffe588);
        bVar3 = std::__detail::operator!=(&local_278,&local_280);
        bVar16 = false;
        if (bVar3) {
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                                 *)0x2c2e57);
          bVar16 = ppVar8->second < local_88;
        }
        if (bVar16) {
          local_249 = 1;
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                                 *)0x2c2e92);
          local_248 = ppVar8->second;
        }
      }
      if ((local_249 & 1) != 0) {
        pvVar7 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)(in_RSI + 0x3b8),(size_type)in_RCX);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar7,local_248);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
        std::operator+((char *)in_stack_ffffffffffffe5d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
        std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
        std::__cxx11::string::operator+=(local_b8,local_2c0);
        std::__cxx11::string::~string(local_2c0);
        std::__cxx11::string::~string(local_2e0);
        std::
        vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                      *)(in_RSI + 0x388),(size_type)in_RCX);
        local_2e8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
             ::find((unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
                     *)in_stack_ffffffffffffe588,(key_type *)0x2c2f8b);
        std::
        vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                      *)(in_RSI + 0x388),(size_type)in_RCX);
        local_2f0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
             ::end((unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
                    *)in_stack_ffffffffffffe588);
        bVar3 = std::__detail::operator!=(&local_2e8,&local_2f0);
        bVar16 = false;
        if (bVar3) {
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                                 *)0x2c3005);
          bVar16 = ppVar8->second < local_88;
        }
        if (bVar16) {
          local_249 = 0;
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                                 *)0x2c3043);
          local_248 = ppVar8->second;
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)(in_RSI + 0x3b8),(size_type)in_RCX);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar7,local_248);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
          std::__cxx11::string::operator=(local_2a0,local_310);
          std::__cxx11::string::~string(local_310);
          std::operator+((char *)in_stack_ffffffffffffe5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
          std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
          std::__cxx11::string::operator+=(local_b8,local_330);
          std::__cxx11::string::~string(local_330);
          std::__cxx11::string::~string(local_350);
        }
        else {
          genProductString_abi_cxx11_
                    (in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8,
                     in_stack_ffffffffffffe7b0);
          std::__cxx11::string::operator+=(local_b8,local_370);
          std::__cxx11::string::~string(local_370);
        }
        local_91 = 1;
        std::__cxx11::string::~string(local_2a0);
      }
    }
    if ((local_91 & 1) == 0) {
      genProductString_abi_cxx11_
                (in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8,
                 in_stack_ffffffffffffe7b0);
      std::__cxx11::string::operator+=(local_b8,local_390);
      std::__cxx11::string::~string(local_390);
    }
    offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::operator+(in_stack_ffffffffffffe598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe590);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::__cxx11::string::operator+=((string *)in_RDI,local_3b0);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_470);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string(local_450);
    vVar1 = *(value_type *)(in_RSI + 0x3d0);
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RSI + 0x3b8),(size_type)in_RCX);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar7,local_88)
    ;
    *pvVar9 = vVar1;
    *(long *)(in_RSI + 0x3d0) = *(long *)(in_RSI + 0x3d0) + 1;
    std::__cxx11::string::~string(local_b8);
    local_88 = local_88 + 1;
  }
  local_478 = 0;
  while( true ) {
    uVar2 = local_478;
    pvVar10 = std::
              vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
              ::operator[]((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                            *)(in_RSI + 0x3f0),(size_type)in_RCX);
    sVar4 = std::
            vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
            ::size(pvVar10);
    if (sVar4 <= uVar2) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_498,"",&local_499);
    std::allocator<char>::~allocator((allocator<char> *)&local_499);
    pvVar10 = std::
              vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
              ::operator[]((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                            *)(in_RSI + 0x3f0),(size_type)in_RCX);
    local_4a8 = std::
                vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                ::operator[](pvVar10,local_478);
    local_4b0._M_current =
         (pair<unsigned_long,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)in_stack_ffffffffffffe588);
    local_4b8 = (pair<unsigned_long,_unsigned_long> *)
                std::
                vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_ffffffffffffe588);
    while (bVar16 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)in_stack_ffffffffffffe590,
                               (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)in_stack_ffffffffffffe588), bVar16) {
      local_4c0 = __gnu_cxx::
                  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::operator*(&local_4b0);
      std::operator+((char *)in_stack_ffffffffffffe5d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::__cxx11::string::operator+=(local_498,local_4e0);
      std::__cxx11::string::~string(local_4e0);
      std::__cxx11::string::~string(local_500);
      std::__cxx11::string::~string(local_560);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::string::~string(local_540);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::operator++(&local_4b0);
    }
    std::__cxx11::string::pop_back();
    offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::operator+(in_stack_ffffffffffffe598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe590);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::__cxx11::string::operator+=((string *)in_RDI,local_580);
    std::__cxx11::string::~string(local_580);
    std::__cxx11::string::~string(local_5a0);
    std::__cxx11::string::~string(local_5c0);
    std::__cxx11::string::~string(local_5e0);
    std::__cxx11::string::~string(local_640);
    std::__cxx11::string::~string(local_600);
    std::__cxx11::string::~string(local_620);
    vVar1 = *(value_type *)(in_RSI + 0x420);
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RSI + 0x408),(size_type)in_RCX);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (pvVar7,local_478);
    *pvVar9 = vVar1;
    *(long *)(in_RSI + 0x420) = *(long *)(in_RSI + 0x420) + 1;
    std::__cxx11::string::~string(local_498);
    local_478 = local_478 + 1;
  }
  local_648 = 0;
  while( true ) {
    uVar2 = local_648;
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RSI + 0x5b0),(size_type)in_RCX);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar7);
    if (sVar4 <= uVar2) break;
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RSI + 0x5b0),(size_type)in_RCX);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (pvVar7,local_648);
    local_650 = *pvVar9;
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RSI + 0x550),local_650);
    boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffe5d8,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
    bVar16 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffe590,in_stack_ffffffffffffe588);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c3d09);
    if (!bVar16) break;
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RSI + 0x598),local_650);
    local_678 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2c3d3d
                          );
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_698,"",&local_699);
    std::allocator<char>::~allocator((allocator<char> *)&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6c0,"",&local_6c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    sVar4 = local_678;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2c3df8);
    sVar6 = QueryCompiler::numberOfViews((QueryCompiler *)0x2c3e00);
    if (sVar4 < sVar6) {
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::__cxx11::string::operator+=(local_698,local_6e8);
      std::__cxx11::string::~string(local_6e8);
      std::__cxx11::string::~string(local_708);
      std::__cxx11::string::~string(local_728);
      std::__cxx11::string::~string(local_748);
      std::__cxx11::string::~string(local_768);
      std::__cxx11::string::~string(local_788);
      std::__cxx11::string::~string(local_b68);
      std::__cxx11::string::~string(local_7a8);
      std::__cxx11::string::~string(local_7c8);
      std::__cxx11::string::~string(local_7e8);
      std::__cxx11::string::~string(local_808);
      std::__cxx11::string::~string(local_828);
      std::__cxx11::string::~string(local_848);
      std::__cxx11::string::~string(local_868);
      std::__cxx11::string::~string(local_888);
      std::__cxx11::string::~string(local_8a8);
      std::__cxx11::string::~string(local_b48);
      std::__cxx11::string::~string(local_8c8);
      std::__cxx11::string::~string(local_8e8);
      std::__cxx11::string::~string(local_b28);
      std::__cxx11::string::~string(local_908);
      std::__cxx11::string::~string(local_928);
      std::__cxx11::string::~string(local_948);
      std::__cxx11::string::~string(local_968);
      std::__cxx11::string::~string(local_988);
      std::__cxx11::string::~string(local_9a8);
      std::__cxx11::string::~string(local_9c8);
      std::__cxx11::string::~string(local_9e8);
      std::__cxx11::string::~string(local_b08);
      std::__cxx11::string::~string(local_a08);
      std::__cxx11::string::~string(local_a28);
      std::__cxx11::string::~string(local_a48);
      std::__cxx11::string::~string(local_a68);
      std::__cxx11::string::~string(local_a88);
      std::__cxx11::string::~string(local_aa8);
      std::__cxx11::string::~string(local_ac8);
      std::__cxx11::string::~string(local_ae8);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::__cxx11::string::operator+=(local_6c0,local_b88);
      std::__cxx11::string::~string(local_b88);
      std::__cxx11::string::~string(local_ba8);
      std::__cxx11::string::~string(local_bc8);
      std::__cxx11::string::~string(local_c68);
      std::__cxx11::string::~string(local_be8);
      std::__cxx11::string::~string(local_c08);
      std::__cxx11::string::~string(local_c28);
      std::__cxx11::string::~string(local_c48);
    }
    else {
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::__cxx11::string::operator+=(local_698,local_c88);
      std::__cxx11::string::~string(local_c88);
      std::__cxx11::string::~string(local_ca8);
      std::__cxx11::string::~string(local_cc8);
      std::__cxx11::string::~string(local_ce8);
      std::__cxx11::string::~string(local_d08);
      std::__cxx11::string::~string(local_d28);
      std::__cxx11::string::~string(local_d48);
      std::__cxx11::string::~string(local_d68);
      std::__cxx11::string::~string(local_d88);
      std::__cxx11::string::~string(local_1028);
      std::__cxx11::string::~string(local_da8);
      std::__cxx11::string::~string(local_dc8);
      std::__cxx11::string::~string(local_1008);
      std::__cxx11::string::~string(local_de8);
      std::__cxx11::string::~string(local_e08);
      std::__cxx11::string::~string(local_e28);
      std::__cxx11::string::~string(local_e48);
      std::__cxx11::string::~string(local_e68);
      std::__cxx11::string::~string(local_e88);
      std::__cxx11::string::~string(local_ea8);
      std::__cxx11::string::~string(local_ec8);
      std::__cxx11::string::~string(local_fe8);
      std::__cxx11::string::~string(local_ee8);
      std::__cxx11::string::~string(local_f08);
      std::__cxx11::string::~string(local_f28);
      std::__cxx11::string::~string(local_f48);
      std::__cxx11::string::~string(local_f68);
      std::__cxx11::string::~string(local_f88);
      std::__cxx11::string::~string(local_fa8);
      std::__cxx11::string::~string(local_fc8);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
      std::operator+(in_stack_ffffffffffffe598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe590);
      std::__cxx11::string::operator=(local_6c0,local_1048);
      std::__cxx11::string::~string(local_1048);
      std::__cxx11::string::~string(local_1068);
      std::__cxx11::string::~string(local_1088);
      std::__cxx11::string::~string((string *)(local_1148 + 0x20));
      std::__cxx11::string::~string(local_10a8);
      std::__cxx11::string::~string(local_10c8);
      std::__cxx11::string::~string(local_10e8);
      std::__cxx11::string::~string(local_1108);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1148,"",&local_1149);
    std::allocator<char>::~allocator((allocator<char> *)&local_1149);
    in_stack_ffffffffffffe590 = (AggregateIndexes *)local_1148;
    in_stack_ffffffffffffe588 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x0
    ;
    genAggLoopStringCompressed
              (in_RDX,node_00,in_R8,in_R9,(dyn_bitset *)in_RCX,unaff_retaddr,in_stack_00000008);
    std::__cxx11::string::operator+=(local_698,local_1170);
    std::__cxx11::string::~string(local_1170);
    std::operator+(in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
    std::operator+(in_stack_ffffffffffffe598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe590);
    std::__cxx11::string::operator+=((string *)in_RDI,local_1190);
    std::__cxx11::string::~string(local_1190);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffee50);
    if ((multifaq::cppgen::COMPRESS_AGGREGATES & 1) == 0) {
      local_12b8 = 0;
      while( true ) {
        uVar2 = local_12b8;
        pvVar11 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RSI + 0x2f0),local_650);
        sVar4 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar11);
        if (sVar4 <= uVar2) break;
        pvVar11 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RSI + 0x2f0),local_650);
        local_12c0 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                               (pvVar11,local_12b8);
        if ((local_12c0->postLoopAgg & 1U) != 0) {
          offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
          std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
          std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
          std::__cxx11::string::operator+=((string *)in_RDI,local_12e0);
          std::__cxx11::string::~string(local_12e0);
          std::__cxx11::string::~string(local_1300);
          std::__cxx11::string::~string(local_1360);
          std::__cxx11::string::~string(local_1320);
          std::__cxx11::string::~string(local_1340);
          uVar2 = (local_12c0->previous).first;
          sVar4 = std::
                  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)(in_RSI + 0x550));
          if (uVar2 < sVar4) {
            pvVar13 = std::
                      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    *)(in_RSI + 0x338),in_R8);
            pvVar7 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](pvVar13,(local_12c0->previous).first);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (pvVar7,(local_12c0->previous).second);
            std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
            std::operator+((char *)in_stack_ffffffffffffe5d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
            std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
            std::__cxx11::string::operator+=((string *)in_RDI,local_13a0);
            std::__cxx11::string::~string(local_13a0);
            std::__cxx11::string::~string(local_13c0);
            std::__cxx11::string::~string(local_1380);
          }
          uVar2 = (local_12c0->postLoop).first;
          sVar4 = std::
                  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)(in_RSI + 0x550));
          if (uVar2 < sVar4) {
            pvVar13 = std::
                      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    *)(in_RSI + 0x338),in_R8);
            pvVar7 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](pvVar13,(local_12c0->postLoop).first);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (pvVar7,(local_12c0->postLoop).second);
            std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
            std::operator+((char *)in_stack_ffffffffffffe5d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
            std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
            std::__cxx11::string::operator+=((string *)in_RDI,local_1400);
            std::__cxx11::string::~string(local_1400);
            std::__cxx11::string::~string(local_1420);
            std::__cxx11::string::~string(local_13e0);
          }
          std::__cxx11::string::pop_back();
          std::__cxx11::string::operator+=((string *)in_RDI,";\n");
          vVar1 = *(value_type *)(in_RSI + 0x350);
          pvVar13 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(in_RSI + 0x338),in_R8);
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar13,local_650);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar7,local_12b8);
          *pvVar9 = vVar1;
          *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
        }
        local_12b8 = local_12b8 + 1;
      }
    }
    else {
      AggregateIndexes::AggregateIndexes((AggregateIndexes *)0x2c5c2c);
      AggregateIndexes::AggregateIndexes((AggregateIndexes *)0x2c5c39);
      std::bitset<7UL>::bitset((bitset<7UL> *)0x2c5c46);
      local_1250 = 0;
      local_1258 = 0;
      local_1259 = 0;
      while( true ) {
        uVar2 = local_1250;
        pvVar11 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RSI + 0x2f0),local_650);
        sVar4 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar11);
        if (sVar4 <= uVar2) break;
        pvVar11 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RSI + 0x2f0),local_650);
        local_1268 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                               (pvVar11,local_1250);
        if ((local_1268->postLoopAgg & 1U) != 0) {
          mapAggregateToIndexes
                    (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,
                     (AggRegTuple *)CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0),
                     (size_t *)in_stack_ffffffffffffe5c8,(size_t *)in_stack_ffffffffffffe5c0);
          vVar1 = *(value_type *)(in_RSI + 0x350);
          pvVar13 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(in_RSI + 0x338),in_R8);
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar13,local_650);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar7,local_1250);
          *pvVar9 = vVar1;
          *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
          local_1250 = local_1250 + 1;
          local_1259 = 1;
          break;
        }
        local_1250 = local_1250 + 1;
      }
      while( true ) {
        uVar2 = local_1250;
        pvVar11 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RSI + 0x2f0),local_650);
        sVar4 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar11);
        if (sVar4 <= uVar2) break;
        pvVar11 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RSI + 0x2f0),local_650);
        local_1270 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                               (pvVar11,local_1250);
        if ((local_1270->postLoopAgg & 1U) != 0) {
          AggregateIndexes::reset(in_stack_ffffffffffffe590);
          mapAggregateToIndexes
                    (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,
                     (AggRegTuple *)CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0),
                     (size_t *)in_stack_ffffffffffffe5c8,(size_t *)in_stack_ffffffffffffe5c0);
          bVar16 = AggregateIndexes::isIncrement
                             (in_stack_ffffffffffffe5e8,
                              (AggregateIndexes *)in_stack_ffffffffffffe5e0,
                              (size_t *)in_stack_ffffffffffffe5d8,
                              (bitset<7UL> *)
                              CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
          if (bVar16) {
            local_1258 = local_1258 + 1;
          }
          else {
            in_stack_ffffffffffffe588 =
                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44((int)((ulong)in_stack_ffffffffffffe588 >> 0x20),1);
            outputAggRegTupleString_abi_cxx11_
                      (in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,in_stack_ffffffffffffee48
                       ,in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
                       (bool)in_stack_ffffffffffffee37);
            std::__cxx11::string::operator+=((string *)in_RDI,local_1290);
            std::__cxx11::string::~string(local_1290);
            memcpy(local_11f8,local_1240,0x48);
            local_1258 = 0;
          }
          vVar1 = *(value_type *)(in_RSI + 0x350);
          pvVar13 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(in_RSI + 0x338),in_R8);
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar13,local_650);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar7,local_1250);
          *pvVar9 = vVar1;
          *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
        }
        local_1250 = local_1250 + 1;
      }
      if ((local_1259 & 1) != 0) {
        in_stack_ffffffffffffe588 =
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44((int)((ulong)in_stack_ffffffffffffe588 >> 0x20),1);
        outputAggRegTupleString_abi_cxx11_
                  (in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,
                   in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
                   (bool)in_stack_ffffffffffffee37);
        std::__cxx11::string::operator+=((string *)in_RDI,local_12b0);
        std::__cxx11::string::~string(local_12b0);
      }
    }
    std::__cxx11::string::~string((string *)local_1148);
    std::__cxx11::string::~string(local_6c0);
    std::__cxx11::string::~string(local_698);
    local_648 = local_648 + 1;
  }
  local_1428 = *(ulong *)(in_RSI + 0x350);
  if ((multifaq::cppgen::COMPRESS_AGGREGATES & 1) == 0) {
    local_1530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    while( true ) {
      in_stack_ffffffffffffe5c0 = local_1530;
      pvVar11 = std::
                vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                              *)(in_RSI + 0x2f0),(size_type)in_RCX);
      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar11);
      if (pbVar15 <= in_stack_ffffffffffffe5c0) break;
      pvVar11 = std::
                vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                              *)(in_RSI + 0x2f0),(size_type)in_RCX);
      local_1538 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                             (pvVar11,(size_type)local_1530);
      if ((local_1538->postLoopAgg & 1U) == 0) {
        offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
        std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
        std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
        std::__cxx11::string::operator+=((string *)in_RDI,local_1558);
        std::__cxx11::string::~string(local_1558);
        std::__cxx11::string::~string(local_1578);
        std::__cxx11::string::~string(local_15d8);
        std::__cxx11::string::~string(local_1598);
        std::__cxx11::string::~string(local_15b8);
        uVar17 = (local_1538->previous).first;
        sVar4 = std::
                vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        *)(in_RSI + 0x550));
        if (uVar17 < sVar4) {
          pvVar13 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(in_RSI + 0x338),local_1538->prevDepth);
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar13,(local_1538->previous).first);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar7,(local_1538->previous).second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
          std::operator+((char *)in_stack_ffffffffffffe5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
          std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
          std::__cxx11::string::operator+=((string *)in_RDI,local_1618);
          std::__cxx11::string::~string(local_1618);
          std::__cxx11::string::~string(local_1638);
          std::__cxx11::string::~string(local_15f8);
        }
        if (((local_1538->product).first & 1U) != 0) {
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)(in_RSI + 0x3b8),(size_type)in_RCX);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar7,(local_1538->product).second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
          std::operator+((char *)in_stack_ffffffffffffe5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
          std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
          std::__cxx11::string::operator+=((string *)in_RDI,local_1678);
          std::__cxx11::string::~string(local_1678);
          std::__cxx11::string::~string(local_1698);
          std::__cxx11::string::~string(local_1658);
        }
        if ((local_1538->newViewProduct & 1U) == 0) {
          if ((local_1538->singleViewAgg & 1U) != 0) {
            std::operator+((char *)in_stack_ffffffffffffe5d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
            std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
            std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
            std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
            std::__cxx11::string::operator+=((string *)in_RDI,local_1718);
            std::__cxx11::string::~string(local_1718);
            std::__cxx11::string::~string(local_1738);
            std::__cxx11::string::~string(local_1798);
            std::__cxx11::string::~string(local_1758);
            std::__cxx11::string::~string(local_1778);
          }
        }
        else {
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)(in_RSI + 0x408),(size_type)in_RCX);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar7,(local_1538->viewAgg).second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
          std::operator+((char *)in_stack_ffffffffffffe5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
          std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
          std::__cxx11::string::operator+=((string *)in_RDI,local_16d8);
          std::__cxx11::string::~string(local_16d8);
          std::__cxx11::string::~string(local_16f8);
          std::__cxx11::string::~string(local_16b8);
        }
        if ((local_1538->multiplyByCount & 1U) != 0) {
          std::__cxx11::string::operator+=((string *)in_RDI,"count*");
        }
        uVar17 = (local_1538->postLoop).first;
        sVar4 = std::
                vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        *)(in_RSI + 0x550));
        if (uVar17 < sVar4) {
          pvVar13 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(in_RSI + 0x338),in_R8);
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar13,(local_1538->postLoop).first);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (pvVar7,(local_1538->postLoop).second);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
          std::operator+((char *)in_stack_ffffffffffffe5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0));
          std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
          std::__cxx11::string::operator+=((string *)in_RDI,local_17d8);
          std::__cxx11::string::~string(local_17d8);
          std::__cxx11::string::~string(local_17f8);
          std::__cxx11::string::~string(local_17b8);
        }
        std::__cxx11::string::pop_back();
        std::__cxx11::string::operator+=((string *)in_RDI,";\n");
        vVar1 = *(value_type *)(in_RSI + 0x350);
        pvVar13 = std::
                  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                *)(in_RSI + 0x338),in_R8);
        pvVar7 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar13,(size_type)in_RCX);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar7,(size_type)local_1530);
        *pvVar9 = vVar1;
        *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
      }
      local_1530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_1530->field_0x1;
    }
  }
  else {
    AggregateIndexes::AggregateIndexes((AggregateIndexes *)0x2c6823);
    AggregateIndexes::AggregateIndexes((AggregateIndexes *)0x2c6830);
    std::bitset<7UL>::bitset((bitset<7UL> *)0x2c683d);
    local_14c8 = (AggregateIndexes *)0x0;
    local_14d0 = 0;
    local_14d1 = 0;
    while( true ) {
      this_00 = local_14c8;
      pvVar11 = std::
                vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                              *)(in_RSI + 0x2f0),(size_type)in_RCX);
      pAVar12 = (AggregateIndexes *)
                std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar11);
      if (pAVar12 <= this_00) break;
      pvVar11 = std::
                vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                              *)(in_RSI + 0x2f0),(size_type)in_RCX);
      local_14e0 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                             (pvVar11,(size_type)local_14c8);
      if ((local_14e0->postLoopAgg & 1U) == 0) {
        pvVar11 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RSI + 0x2f0),(size_type)in_RCX);
        std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                  (pvVar11,(size_type)local_14c8);
        mapAggregateToIndexes
                  (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,
                   (AggRegTuple *)CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0),
                   (size_t *)in_stack_ffffffffffffe5c8,(size_t *)in_stack_ffffffffffffe5c0);
        local_14d1 = 1;
        in_stack_ffffffffffffe5e0 = *(CppGenerator **)(in_RSI + 0x350);
        pvVar13 = std::
                  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                *)(in_RSI + 0x338),in_R8);
        pvVar7 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar13,(size_type)in_RCX);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar7,(size_type)local_14c8);
        *pvVar9 = (value_type)in_stack_ffffffffffffe5e0;
        *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
        local_14c8 = (AggregateIndexes *)
                     ((long)&(local_14c8->present).super__Base_bitset<1UL>._M_w + 1);
        break;
      }
      local_14c8 = (AggregateIndexes *)
                   ((long)&(local_14c8->present).super__Base_bitset<1UL>._M_w + 1);
    }
    while( true ) {
      pAVar12 = local_14c8;
      pvVar11 = std::
                vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                              *)(in_RSI + 0x2f0),(size_type)in_RCX);
      pAVar14 = (AggregateIndexes *)
                std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar11);
      if (pAVar14 <= pAVar12) break;
      pvVar11 = std::
                vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                              *)(in_RSI + 0x2f0),(size_type)in_RCX);
      local_14e8 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                             (pvVar11,(size_type)local_14c8);
      if ((local_14e8->postLoopAgg & 1U) == 0) {
        AggregateIndexes::reset(in_stack_ffffffffffffe590);
        pvVar11 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RSI + 0x2f0),(size_type)in_RCX);
        std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::operator[]
                  (pvVar11,(size_type)local_14c8);
        mapAggregateToIndexes
                  (in_stack_ffffffffffffe5e0,pAVar12,
                   (AggRegTuple *)CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0),
                   (size_t *)in_stack_ffffffffffffe5c8,(size_t *)in_stack_ffffffffffffe5c0);
        in_stack_ffffffffffffe5d7 =
             AggregateIndexes::isIncrement
                       (this_00,(AggregateIndexes *)in_stack_ffffffffffffe5e0,(size_t *)pAVar12,
                        (bitset<7UL> *)CONCAT17(in_stack_ffffffffffffe5d7,in_stack_ffffffffffffe5d0)
                       );
        if ((bool)in_stack_ffffffffffffe5d7) {
          local_14d0 = local_14d0 + 1;
        }
        else {
          outputAggRegTupleString_abi_cxx11_
                    (in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,
                     in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
                     (bool)in_stack_ffffffffffffee37);
          std::__cxx11::string::operator+=((string *)in_RDI,local_1508);
          std::__cxx11::string::~string(local_1508);
          memcpy(local_1470,local_14b8,0x48);
          local_14d0 = 0;
        }
        in_stack_ffffffffffffe5c8 = *(CppGenerator **)(in_RSI + 0x350);
        pvVar13 = std::
                  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                *)(in_RSI + 0x338),in_R8);
        pvVar7 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar13,(size_type)in_RCX);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar7,(size_type)local_14c8);
        *pvVar9 = (value_type)in_stack_ffffffffffffe5c8;
        *(long *)(in_RSI + 0x350) = *(long *)(in_RSI + 0x350) + 1;
      }
      local_14c8 = (AggregateIndexes *)
                   ((long)&(local_14c8->present).super__Base_bitset<1UL>._M_w + 1);
    }
    if ((local_14d1 & 1) != 0) {
      outputAggRegTupleString_abi_cxx11_
                (in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,in_stack_ffffffffffffee48,
                 in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,(bool)in_stack_ffffffffffffee37
                );
      std::__cxx11::string::operator+=((string *)in_RDI,local_1528);
      std::__cxx11::string::~string(local_1528);
    }
  }
  if (local_1428 < *(ulong *)(in_RSI + 0x350)) {
    if (local_48 == (_Alloc_hider *)0x0) {
      local_1800 = (_Alloc_hider *)(in_R8 + 3);
    }
    else {
      local_1800 = local_48 + in_R8 + 2;
    }
    offset_abi_cxx11_(in_stack_ffffffffffffe5c8,(size_t)in_stack_ffffffffffffe5c0);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe5c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    std::operator+(in_stack_ffffffffffffe598,(char *)in_stack_ffffffffffffe590);
    std::__cxx11::string::operator+=(in_stack_00000010,local_1820);
    std::__cxx11::string::~string(local_1820);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffe7c0);
    std::__cxx11::string::~string(local_1900);
    std::__cxx11::string::~string(local_1860);
    std::__cxx11::string::~string(local_1880);
    std::__cxx11::string::~string(local_18e0);
    std::__cxx11::string::~string(local_18a0);
    std::__cxx11::string::~string(local_18c0);
  }
  local_49 = 1;
  std::__cxx11::string::~string(local_80);
  if ((local_49 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string CppGenerator::genAggLoopStringCompressed(
    const TDNode& node, const size_t currentLoop,size_t depth,
    const dyn_bitset& contributingViews,const size_t numOfOutViewLoops,
    std::string& resetString)
{
    const size_t thisLoopID = currentLoop;
    const dyn_bitset& thisLoop = listOfLoops[thisLoopID];
    size_t numOfLoops = thisLoop.count() + numOfOutViewLoops;
    
    std::string returnString = "";
    std::string depthString = std::to_string(depth);
        
    // Print all products for this considered loop
    for (size_t prodID = 0; prodID < localProductList[thisLoopID].size(); ++prodID)
    {
        const prod_bitset& product = localProductList[thisLoopID][prodID];
        
        // std::cout << product << std::endl;
        
        bool decomposedProduct = false;
        std::string productString = "";

        // We now check if parts of the product have already been computed 
        if (product.count() > 1)
        {
            prod_bitset subProduct = product;
            prod_bitset removedFunctions;

            size_t subProductID;

            bool foundSubProduct = false;
            while (!foundSubProduct && subProduct.count() > 1)
            {
                size_t highestPosition = 0;
                // need to continue with this the next loop
                for (size_t f = NUM_OF_FUNCTIONS; f > 0; f--)
                {
                    if (subProduct[f])
                    {
                        highestPosition = f;
                        break;
                    }
                }
                
                subProduct.reset(highestPosition);
                removedFunctions.set(highestPosition);

                auto local_it = localProductMap[thisLoopID].find(subProduct);
                if (local_it != localProductMap[thisLoopID].end() &&
                    local_it->second < prodID)
                {
                    foundSubProduct = true;
                    subProductID = local_it->second;
                }
            }
            

            if (foundSubProduct)
            {
                std::string local = std::to_string(
                    localProductRemapping[thisLoopID][subProductID]);

                productString += "localRegister["+local+"]*";
                    
                auto local_it = localProductMap[thisLoopID].find(removedFunctions);
                if (local_it != localProductMap[thisLoopID].end() &&
                    local_it->second < prodID)
                {
                    foundSubProduct = false;
                    subProductID = local_it->second;

                    local = std::to_string(
                        localProductRemapping[thisLoopID][subProductID]);
                    productString += "localRegister["+local+"]";
                }
                else
                {
                    productString += genProductString(
                        node,contributingViews,removedFunctions);
                }

                decomposedProduct = true;
            }
        }
        
        // We turn the product into a string
        if (!decomposedProduct)
            productString += genProductString(node,contributingViews,product);

        returnString += offset(3+depth+numOfLoops)+"localRegister["+
            std::to_string(productCounter)+"] = "+productString + ";\n";
        
        // increment the counter and update the remapping array
        localProductRemapping[thisLoopID][prodID] = productCounter;
        ++productCounter;
    }

    for (size_t viewProd = 0; viewProd < viewProductList[thisLoopID].size(); ++viewProd)
    {   
        std::string viewProduct = "";
        for (const std::pair<size_t, size_t>& viewAgg : viewProductList[thisLoopID][viewProd])
        {
            viewProduct += "aggregates_"+viewName[viewAgg.first]+"["+
                std::to_string(viewAgg.second)+"]*";
        }   
        viewProduct.pop_back();

        returnString += offset(3+depth+numOfLoops)+
            "viewRegister["+std::to_string(viewCounter)+"] = "+
            viewProduct +";\n";

        // Increment the counter and update the remapping array
        viewProductRemapping[thisLoopID][viewProd] = viewCounter;
        ++viewCounter;
    }

    
    // Recurse to the next loop(s) if possible
    for (size_t next=0; next < nextLoopsPerLoop[thisLoopID].size(); ++next)
    {
        size_t nextLoop = nextLoopsPerLoop[thisLoopID][next];

        if (((listOfLoops[nextLoop] & thisLoop) == thisLoop))
        {
            size_t viewID = viewsPerLoop[nextLoop].find_first();

            std::string loopString = "", closeLoopString = "";
            if (viewID < _qc->numberOfViews())
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+viewName[viewID]+
                    " = lowerptr_"+viewName[viewID]+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+viewName[viewID]+
                    " <= upperptr_"+viewName[viewID]+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+viewName[viewID]+
                    "_tuple &"+viewName[viewID]+"Tuple = "+viewName[viewID]+
                    "[ptr_"+viewName[viewID]+"];\n"+
                    offset(4+depth+numOfLoops)+"double *aggregates_"+viewName[viewID]+
                    " = "+viewName[viewID]+"Tuple.aggregates;\n";
                
                closeLoopString += offset(4+depth+numOfLoops)+"++ptr_"+viewName[viewID]+
                    ";\n"+offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }
            else 
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+node._name+
                    " = lowerptr_"+node._name+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+node._name+
                    " <= upperptr_"+node._name+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+node._name +
                    "_tuple &"+node._name+"Tuple = "+node._name+
                    "[ptr_"+node._name+"];\n";
                
                closeLoopString = offset(4+depth+numOfLoops)+"++ptr_"+node._name+";\n"+
                    offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }

            std::string resetAggregates = "";

            loopString += genAggLoopStringCompressed(
                node, nextLoop, depth, contributingViews, 0, resetAggregates);

            returnString += resetAggregates + loopString + closeLoopString;

            if (COMPRESS_AGGREGATES)
            {                    
                // After recurse, add the aggregates that have been added with post FLAG
                AggregateIndexes bench, aggIdx;
                std::bitset<7> increasingIndexes;
                size_t aggID = 0, off = 0;

                bool addedAggregates = false;

                // Loop to identify the first bench
                for (; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        mapAggregateToIndexes(aggIdx,regTuple,depth,nextLoop);

                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;

                        ++aggID; // TODO: Make sure that this is necessary!!
                        addedAggregates = true;
                        break;
                    }
                }   
            
                // Loop over all other aggregates 
                for (; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        aggIdx.reset();
                    
                        mapAggregateToIndexes(aggIdx,regTuple,depth,nextLoop);

                        if (aggIdx.isIncrement(bench,off,increasingIndexes))
                        {
                            ++off;
                        }
                        else
                        {
                            // If not, output bench and all offset aggregates
                            returnString += outputAggRegTupleString(
                                bench,off,increasingIndexes, 3+depth+numOfLoops,true);
                        
                            // make aggregate the bench and set offset to 0
                            bench = aggIdx;
                            off = 0;
                        }

                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;
                    }
                }

                // Output bench -- and any further aggregates (if there were any)
                if (addedAggregates)
                    returnString += outputAggRegTupleString(
                        bench,off,increasingIndexes,3+depth+numOfLoops,true);
            }
            else
            {
                // here we output the aggregates uncompressed -TODO: we could probably
                // remove this and incorporate it in the previous part
            
                // After recurse, add the aggregates that have been added with post FLAG
                for (size_t aggID = 0; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        // We use a mapping to the correct index
                        returnString += offset(3+depth+numOfLoops)+
                            "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";

                        if (regTuple.previous.first < listOfLoops.size())
                        {
                            std::string local = std::to_string(
                                newAggregateRemapping[depth]
                                [regTuple.previous.first]
                                [regTuple.previous.second]);
                            returnString += "aggregateRegister["+local+"]*";
                        }

                        if (regTuple.postLoop.first < listOfLoops.size())
                        {
                            std::string post = std::to_string(
                                newAggregateRemapping[depth][regTuple.postLoop.first]
                                [regTuple.postLoop.second]); 
                            returnString += "aggregateRegister["+post+"]*";
                        }
                        
                        returnString.pop_back();
                        returnString += ";\n";
            
                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;
                    }
                }
            }
        }
        else break;
    }
    
    size_t startingOffset = aggregateCounter;
    
    if (COMPRESS_AGGREGATES)
    {        
        // After recurse, add the aggregates that have been added with post FLAG
        AggregateIndexes bench, aggIdx;
        std::bitset<7> increasingIndexes;
        size_t aggID = 0, off = 0;
    
        bool addedAggregates = false;

        // Loop to identify the first bench
        for (; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                mapAggregateToIndexes
                    (bench,newAggregateRegister[thisLoopID][aggID],depth,thisLoopID);
            
                addedAggregates = true;

                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;

                ++aggID;
                break;
            }
        }

        // Loop over all other aggregates 
        for (; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                aggIdx.reset();
            
                mapAggregateToIndexes
                    (aggIdx,newAggregateRegister[thisLoopID][aggID],depth,thisLoopID);

                if (aggIdx.isIncrement(bench,off,increasingIndexes))
                {
                    ++off;
                }
                else
                {
                    // If not, output bench and all offset aggregates
                    returnString += outputAggRegTupleString(bench,off,increasingIndexes,
                                                            3+depth+numOfLoops,false);
                
                    // make aggregate the bench and set offset to 0
                    bench = aggIdx;
                    off = 0;
                }

                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;
            }
        }

        // Output bench -- and any further aggregates (if there were any)
        if (addedAggregates)
            returnString += outputAggRegTupleString(
                bench,off,increasingIndexes,3+depth+numOfLoops,false);
    }
    else
    {
        
        for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                // We use a mapping to the correct index
                returnString += offset(3+depth+numOfLoops)+
                    "aggregateRegister["+std::to_string(aggregateCounter)+"] += ";

                if (regTuple.previous.first < listOfLoops.size())
                {
                    std::string prev = std::to_string(
                        newAggregateRemapping[regTuple.prevDepth]
                        [regTuple.previous.first]
                        [regTuple.previous.second]);
                
                    returnString += "aggregateRegister["+prev+"]*";
                }
            
                if (regTuple.product.first)
                {
                    std::string local = std::to_string(
                        localProductRemapping[thisLoopID][regTuple.product.second]
                        );
                    returnString += "localRegister["+local+"]*";
                }
        
                if (regTuple.newViewProduct)
                {
                    std::string view = std::to_string(
                        viewProductRemapping[thisLoopID][regTuple.viewAgg.second]);
                    returnString += "viewRegister["+view+"];";
                }
                else if (regTuple.singleViewAgg)
                {
                    returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                        std::to_string(regTuple.viewAgg.second)+"]*";
                }
            
                if (regTuple.multiplyByCount)
                    returnString +=  "count*";

                if (regTuple.postLoop.first < listOfLoops.size())
                {
                    std::string postLoop = std::to_string(
                        newAggregateRemapping[depth][regTuple.postLoop.first]
                        [regTuple.postLoop.second]);
                    returnString += "aggregateRegister["+postLoop+"]*";
                }
            
                returnString.pop_back();
                returnString += ";\n";
            
                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;
            }
        }
    }
    

    if (aggregateCounter > startingOffset)
    {
        size_t resetOffset = (numOfLoops == 0 ? 3+depth : 2+depth+numOfLoops);
        resetString += offset(resetOffset)+"memset(&aggregateRegister["+
            std::to_string(startingOffset)+"], 0, sizeof(double) * "+
            std::to_string(aggregateCounter-startingOffset)+");\n";
    }
    
    return returnString;
}